

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::CreateDescriptorNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes,
          initializer_list<unsigned_long> sizes)

{
  const_iterator puVar1;
  size_type sVar2;
  const_iterator pbVar3;
  const_pointer __src;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  optional<google::protobuf::internal::DescriptorNames> oVar5;
  uint16_t size16;
  size_t size_1;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  initializer_list<unsigned_long> *__range3_3;
  DescriptorNames res;
  string_view b_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range3_2;
  char *out;
  basic_string_view<char,_std::char_traits<char>_> b;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range3_1;
  size_t total_size;
  size_t size;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<unsigned_long> *__range3;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  initializer_list<unsigned_long> sizes_local;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes_local;
  undefined1 local_10;
  
  sizes_local._M_array = (iterator)sizes._M_len;
  this_local = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)sizes._M_array;
  bytes_local._M_array = (iterator)bytes._M_len;
  sizes_local._M_len = (size_type)bytes._M_array;
  __end3 = std::initializer_list<unsigned_long>::begin
                     ((initializer_list<unsigned_long> *)&this_local);
  puVar1 = std::initializer_list<unsigned_long>::end((initializer_list<unsigned_long> *)&this_local)
  ;
  do {
    if (__end3 == puVar1) {
      __range3_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0;
      __end3_1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::
                 begin((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &sizes_local._M_len);
      b._M_str = (char *)std::
                         initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         end((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>
                              *)&sizes_local._M_len);
      for (; __end3_1 != (const_iterator)b._M_str; __end3_1 = __end3_1 + 1) {
        out = (char *)__end3_1->_M_len;
        b._M_len = (size_t)__end3_1->_M_str;
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&out);
        __range3_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     ((long)&__range3_1->_M_array + sVar2);
      }
      sVar2 = std::initializer_list<unsigned_long>::size
                        ((initializer_list<unsigned_long> *)&this_local);
      __range3_2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   AllocateArray<char>(this,(int)sVar2 * 2 + (int)__range3_1);
      __end3_2 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::
                 begin((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &sizes_local._M_len);
      pbVar3 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                         ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&sizes_local._M_len);
      for (; __end3_2 != pbVar3; __end3_2 = __end3_2 + 1) {
        res.payload_ = (char *)__end3_2->_M_len;
        __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                          ((basic_string_view<char,_std::char_traits<char>_> *)&res);
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&res);
        memcpy(__range3_2,__src,sVar2);
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&res);
        __range3_2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     ((long)&__range3_2->_M_array + sVar2);
      }
      internal::DescriptorNames::DescriptorNames((DescriptorNames *)&__range3_3,(char *)__range3_2);
      __end3_3 = std::initializer_list<unsigned_long>::begin
                           ((initializer_list<unsigned_long> *)&this_local);
      puVar1 = std::initializer_list<unsigned_long>::end
                         ((initializer_list<unsigned_long> *)&this_local);
      for (; __end3_3 != puVar1; __end3_3 = __end3_3 + 1) {
        *(short *)&__range3_2->_M_array = (short)*__end3_3;
        __range3_2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     ((long)&__range3_2->_M_array + 2);
      }
      std::optional<google::protobuf::internal::DescriptorNames>::
      optional<google::protobuf::internal::DescriptorNames,_true>
                ((optional<google::protobuf::internal::DescriptorNames> *)&bytes_local._M_len,
                 (DescriptorNames *)&__range3_3);
      uVar4 = extraout_RDX_00;
LAB_0019c10a:
      oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload
      .super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._9_7_ =
           (undefined7)((ulong)uVar4 >> 8);
      oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload
      .super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_engaged =
           (bool)local_10;
      oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload
      .super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload =
           (_Storage<google::protobuf::internal::DescriptorNames,_true>)bytes_local._M_len;
      return (optional<google::protobuf::internal::DescriptorNames>)
             oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
    }
    if (*__end3 != (*__end3 & 0xffff)) {
      std::optional<google::protobuf::internal::DescriptorNames>::optional
                ((optional<google::protobuf::internal::DescriptorNames> *)&bytes_local._M_len);
      uVar4 = extraout_RDX;
      goto LAB_0019c10a;
    }
    __end3 = __end3 + 1;
  } while( true );
}

Assistant:

std::optional<internal::DescriptorNames> CreateDescriptorNames(
      std::initializer_list<absl::string_view> bytes,
      std::initializer_list<size_t> sizes) {
    for (size_t size : sizes) {
      // Name too long.
      if (size != static_cast<uint16_t>(size)) {
        return std::nullopt;
      }
    }

    size_t total_size = 0;
    for (auto b : bytes) total_size += b.size();
    total_size += sizes.size() * sizeof(uint16_t);
    char* out = AllocateArray<char>(total_size);
    for (absl::string_view b : bytes) {
      memcpy(out, b.data(), b.size());
      out += b.size();
    }
    auto res = internal::DescriptorNames(out);
    for (size_t size : sizes) {
      uint16_t size16 = static_cast<uint16_t>(size);
      memcpy(out, &size16, sizeof(size16));
      out += sizeof(size16);
    }
    return res;
  }